

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_array.h
# Opt level: O0

void __thiscall
SharedMemoryArray<unsigned_int>::SharedMemoryArray
          (SharedMemoryArray<unsigned_int> *this,size_t size)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  size_t __n;
  ContextManager *pCVar3;
  string local_38;
  ulong local_18;
  size_t size_local;
  SharedMemoryArray<unsigned_int> *this_local;
  
  this->size_ = size;
  local_18 = size;
  size_local = (size_t)this;
  puVar2 = (uint *)allocate_shared_memory(size << 2);
  this->ptr_ = puVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_18;
  __n = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  puVar2 = this->ptr_;
  memset(puVar2,0,__n);
  this->ptr_ = puVar2;
  if (this->ptr_ == (uint *)0xffffffffffffffff) {
    pCVar3 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Cannot allocate %zu bytes of shared memory: %m",4);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

explicit SharedMemoryArray(size_t size) : size_(size) {
        ptr_ = static_cast<T *>(allocate_shared_memory(sizeof(T) * size));
        ptr_ = new(ptr_) T[size]();
        if (ptr_ == MAP_FAILED) {
            die(format("Cannot allocate %zu bytes of shared memory: %m", sizeof(T)));
        }
    }